

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  _func_int **value;
  char *pcVar1;
  bool bVar2;
  uint value_00;
  string *result;
  type tVar3;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  memory_buffer buffer;
  undefined1 in_stack_fffffffffffffda8 [16];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) && (bVar2 = equal2((char *)this,"{}"), bVar2)) {
    if ((long)args_00.desc_ < 0) {
      if (((int)(type)format_str.size_ < 1) ||
         (tVar3 = (args_00.field_1.args_)->type_, tVar3 == none_type)) goto LAB_001180e3;
    }
    else {
      tVar3 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_001180e3:
        error_handler::on_error((error_handler *)&local_248,"argument not found");
      }
    }
    value = (_func_int **)((args_00.field_1.values_)->field_0).ulong_long_value;
    pcVar1 = (char *)((args_00.field_1.values_)->field_0).string.size;
    value_00 = (uint)value;
    local_248.super_buffer<char>._vptr_buffer = value;
    switch(tVar3) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,value_00);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,value_00);
      break;
    case long_long_type:
      to_string<long_long,_0>(__return_storage_ptr__,(longlong)value);
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>(__return_storage_ptr__,(unsigned_long_long)value);
      break;
    case int128_type:
      to_string<__int128,_0>(__return_storage_ptr__,(__int128)in_stack_fffffffffffffda8);
      break;
    case uint128_type:
      to_string<unsigned___int128,_0>
                (__return_storage_ptr__,(unsigned___int128)in_stack_fffffffffffffda8);
      break;
    case bool_type:
      to_string<bool,_0>(__return_storage_ptr__,(bool)((byte)value & 1));
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (byte)value;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      local_248.super_buffer<char>._vptr_buffer =
           (_func_int **)CONCAT44(local_248.super_buffer<char>._vptr_buffer._4_4_,value_00);
      to_string<float,_0>(__return_storage_ptr__,(float *)&local_248);
      break;
    case double_type:
      to_string<double,_0>(__return_storage_ptr__,(double *)&local_248);
      break;
    case last_numeric_type:
      local_248.super_buffer<char>.ptr_ =
           (char *)CONCAT62(local_248.super_buffer<char>.ptr_._2_6_,(short)pcVar1);
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)&local_248);
      break;
    case cstring_type:
      to_string<const_char_*,_0>(__return_storage_ptr__,(char **)&local_248);
      break;
    case string_type:
      local_248.super_buffer<char>.ptr_ = pcVar1;
      to_string<fmt::v7::basic_string_view<char>,_0>
                (__return_storage_ptr__,(basic_string_view<char> *)&local_248);
      break;
    case pointer_type:
      to_string<const_void_*,_0>(__return_storage_ptr__,(void **)&local_248);
      break;
    case custom_type:
      stringifier::operator()[abi_cxx11_
                (__return_storage_ptr__,(stringifier *)&stack0xfffffffffffffdb7,
                 (handle)((args_00.field_1.values_)->field_0).string);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  else {
    local_248.super_buffer<char>.ptr_ = local_248.store_;
    local_248.super_buffer<char>.size_ = 0;
    local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001404c8;
    local_248.super_buffer<char>.capacity_ = 500;
    format_str_00.data_ = (char *)this;
    vformat_to<char>(&local_248.super_buffer<char>,format_str_00,args_00,(locale_ref)0x0);
    to_string<char,500ul>(__return_storage_ptr__,(v7 *)&local_248,buf);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_248);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}